

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  element_type *peVar2;
  shared_ptr<Instance> local_2c8;
  undefined1 local_2b8 [8];
  Result result;
  undefined1 local_260 [8];
  shared_ptr<Instance> instance;
  ifstream m50n1000;
  undefined1 local_38 [8];
  GeneticAlgorithm geneticAlgorithm;
  LoadingInstance loadInstance;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  LoadingInstance::LoadingInstance
            ((LoadingInstance *)&geneticAlgorithm.destinatedPopulationSize,(istream *)&std::cin);
  GeneticAlgorithm::GeneticAlgorithm((GeneticAlgorithm *)local_38);
  std::ifstream::ifstream
            (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Instances/m50",8);
  result.longestProcessingTime = 0;
  result.numberOfTasks = 0;
  Instance::Instance((Instance *)&result.longestProcessingTime);
  std::make_shared<Instance,Instance>((Instance *)local_260);
  Instance::~Instance((Instance *)&result.longestProcessingTime);
  LoadingInstance::SetSource
            ((LoadingInstance *)&geneticAlgorithm.destinatedPopulationSize,
             (istream *)
             &instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_260);
  LoadingInstance::Build((LoadingInstance *)&geneticAlgorithm.destinatedPopulationSize,peVar2);
  peVar2 = std::__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_260);
  operator<<((ostream *)&std::cout,peVar2);
  std::shared_ptr<Instance>::shared_ptr(&local_2c8,(shared_ptr<Instance> *)local_260);
  GeneticAlgorithm::operator()((Result *)local_2b8,(GeneticAlgorithm *)local_38,&local_2c8);
  std::shared_ptr<Instance>::~shared_ptr(&local_2c8);
  Result::showyourself((Result *)local_2b8);
  Result::~Result((Result *)local_2b8);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)local_260);
  std::ifstream::~ifstream
            (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  GeneticAlgorithm::~GeneticAlgorithm((GeneticAlgorithm *)local_38);
  LoadingInstance::~LoadingInstance((LoadingInstance *)&geneticAlgorithm.destinatedPopulationSize);
  return 0;
}

Assistant:

int main(){
	//Seed for srand
	srand( time (NULL) );
	//Create needed objects
    LoadingInstance loadInstance;

	GeneticAlgorithm geneticAlgorithm;

	std::ifstream m50n1000("Instances/m50");

	auto instance = std::make_shared<Instance>( Instance() );

	//Load data
	loadInstance.SetSource(m50n1000);
	loadInstance.Build(*instance);
   	std::cout << *instance;

	auto result = geneticAlgorithm(instance);
	result.showyourself();

    return 0;
}